

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  size_type sVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  const_reference this;
  reference this_00;
  rep rVar8;
  float fVar9;
  int local_3b0;
  float local_388;
  duration<long,_std::ratio<1L,_1000000000L>_> local_370;
  duration<long,_std::ratio<1L,_1000000L>_> local_368;
  double *local_360;
  double *value;
  const_iterator __end2;
  const_iterator __begin2;
  vector<double,_std::allocator<double>_> *__range2;
  Cluster<double> *cluster;
  const_iterator __end1;
  const_iterator __begin1;
  vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> *__range1;
  time_point t1;
  undefined1 local_2f8 [8];
  vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> clusters;
  time_point t0;
  undefined1 local_2d0 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  points;
  string local_2b0 [36];
  int local_28c;
  string local_288 [4];
  int col_offset;
  string filename;
  istream local_268 [8];
  ifstream infile;
  istream *local_60;
  istream *in;
  allocator local_41;
  string local_40 [32];
  double local_20;
  double bandwidth;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  bandwidth = (double)argv;
  argv_local._0_4_ = argc;
  if (argc < 2) {
    local_388 = 1.0;
  }
  else {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,pcVar1,&local_41);
    local_388 = std::__cxx11::stof((string *)local_40,(size_t *)0x0);
  }
  in._3_1_ = argc >= 2;
  if (in._3_1_) {
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  local_60 = (istream *)&std::cin;
  local_20 = (double)local_388;
  std::ifstream::ifstream(local_268);
  if ((int)argv_local < 3) {
    iVar3 = fileno(_stdin);
    iVar3 = isatty(iVar3);
    if (iVar3 != 0) {
      std::operator<<((ostream *)&std::cout,"Input CSV file: ");
      std::__cxx11::string::string(local_288);
      std::operator>>((istream *)&std::cin,local_288);
      std::ifstream::open(local_268,local_288,8);
      local_60 = local_268;
      std::__cxx11::string::~string(local_288);
    }
  }
  else {
    std::ifstream::open(local_268,*(undefined8 *)((long)bandwidth + 0x10),8);
    local_60 = local_268;
  }
  points.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  points.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
  if ((int)argv_local < 4) {
    local_3b0 = 0;
  }
  else {
    pcVar1 = *(char **)((long)bandwidth + 0x18);
    std::allocator<char>::allocator();
    points.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    std::__cxx11::string::string
              (local_2b0,pcVar1,
               (allocator *)
               ((long)&points.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    points.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
    local_3b0 = std::__cxx11::stoi((string *)local_2b0,(size_t *)0x0,10);
  }
  if ((points.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0) {
    std::__cxx11::string::~string(local_2b0);
  }
  if ((points.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&points.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  local_28c = local_3b0;
  poVar4 = std::operator<<((ostream *)&std::cerr,"Kernel bandwidth: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_20);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  load((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        *)local_2d0,local_60,local_28c);
  poVar4 = std::operator<<((ostream *)&std::cerr,"Num. points: ");
  sVar5 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)local_2d0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::empty((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)local_2d0);
  if (bVar2) {
    argv_local._4_4_ = 0;
  }
  else {
    clusters.super__Vector_base<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::chrono::_V2::system_clock::now();
    cVar6 = std::
            begin<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
                      ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        *)local_2d0);
    cVar7 = std::
            end<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
                      ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        *)local_2d0);
    this = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)local_2d0,0);
    sVar5 = std::vector<double,_std::allocator<double>_>::size(this);
    msc::estimators::Constant::Constant((Constant *)&t1,local_20);
    fVar9 = std::numeric_limits<float>::epsilon();
    iVar3 = std::numeric_limits<int>::max();
    msc::
    mean_shift_cluster<double,__gnu_cxx::__normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,msc::metrics::L2Sq,msc::kernels::ParabolicSq,msc::estimators::Constant>
              (t1.__d.__r,(msc *)(double)fVar9,local_2f8,cVar6._M_current,cVar7._M_current,
               sVar5 & 0xffffffff,iVar3);
    __range1 = (vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> *)
               std::chrono::_V2::system_clock::now();
    poVar4 = std::operator<<((ostream *)&std::cerr,"Clusters (");
    sVar5 = std::vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>::size
                      ((vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> *)
                       local_2f8);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
    poVar4 = std::operator<<(poVar4,"):");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    __end1 = std::vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>::begin
                       ((vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> *)
                        local_2f8);
    cluster = (Cluster<double> *)
              std::vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>::end
                        ((vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> *)
                         local_2f8);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_msc::Cluster<double>_*,_std::vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>_>
                                       *)&cluster), bVar2) {
      this_00 = __gnu_cxx::
                __normal_iterator<const_msc::Cluster<double>_*,_std::vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>_>
                ::operator*(&__end1);
      poVar4 = std::operator<<((ostream *)&std::cerr," - Num. elems.: ");
      sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this_00->members);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
      std::operator<<(poVar4,"; Mode:");
      __end2 = std::vector<double,_std::allocator<double>_>::begin(&this_00->mode);
      value = (double *)std::vector<double,_std::allocator<double>_>::end(&this_00->mode);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                         *)&value), bVar2) {
        local_360 = __gnu_cxx::
                    __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                    ::operator*(&__end2);
        poVar4 = std::operator<<((ostream *)&std::cerr," ");
        std::ostream::operator<<(poVar4,*local_360);
        __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
        ::operator++(&__end2);
      }
      std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<const_msc::Cluster<double>_*,_std::vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>_>
      ::operator++(&__end1);
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,"Elapsed time: ");
    local_370.__r =
         (rep)std::chrono::operator-
                        ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&__range1,
                         (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&clusters.
                             super__Vector_base<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_368.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                        (&local_370);
    rVar8 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_368);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(double)rVar8 / 1000000.0);
    poVar4 = std::operator<<(poVar4," s");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    dump((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *)local_2d0,
         (vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> *)local_2f8);
    argv_local._4_4_ = 0;
    std::vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>::~vector
              ((vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> *)local_2f8);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_2d0);
  std::ifstream::~ifstream(local_268);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    const double bandwidth = argc > 1 ? std::stof(argv[1]) : 1;
    std::istream* in = &std::cin;
    std::ifstream infile;
    if (argc > 2)
    {
        infile.open(argv[2]);
        in = &infile;
    }
    else
    {
        #ifdef _WIN32
        if (_isatty(_fileno(stdin)))
        #else
        if (isatty(fileno(stdin)))
        #endif
        {
            std::cout << "Input CSV file: ";
            std::string filename;
            std::cin >> filename;
            infile.open(filename);
            in = &infile;
        }
    }
    const int col_offset = argc > 3 ? std::stoi(argv[3]) : 0;

    std::cerr << "Kernel bandwidth: " << bandwidth << std::endl;
    const auto points = load(*in, col_offset);
    std::cerr << "Num. points: " << points.size() << std::endl;
    if (points.empty())
        return 0;
    const auto t0 = std::chrono::high_resolution_clock::now();
    const auto clusters = msc::mean_shift_cluster<Scalar>(
        std::begin(points), std::end(points), points[0].size(),
        msc::metrics::L2Sq(),
        msc::kernels::ParabolicSq(),
        msc::estimators::Constant(bandwidth));
    const auto t1 = std::chrono::high_resolution_clock::now();
    std::cerr << "Clusters (" << clusters.size() << "):" << std::endl;
    for (const auto& cluster : clusters)
    {
        std::cerr << " - Num. elems.: " << cluster.members.size() << "; Mode:";
        for (const auto& value : cluster.mode)
            std::cerr << " " << value;
        std::cerr << std::endl;
    }
    std::cerr << "Elapsed time: " << std::chrono::duration_cast<
        std::chrono::microseconds>(t1 - t0).count() / 1e6 << " s" << std::endl;
    dump(points, clusters);
    return 0;
}